

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# po_man.cpp
# Opt level: O3

bool EV_MovePolyTo(line_t *line,int polyNum,double speed,DVector2 *targ,bool overRide)

{
  DInterpolation *this;
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  double dVar4;
  FPolyObj *pFVar5;
  DPolyAction *pDVar6;
  long lVar7;
  bool bVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  FPolyMirrorIterator it;
  undefined1 local_238 [56];
  double dStack_200;
  double dStack_1f0;
  FPolyMirrorIterator local_1d0;
  
  lVar7 = (long)po_NumPolyobjs;
  local_1d0.CurPoly = polyobjs;
  if (0 < lVar7) {
    do {
      if ((local_1d0.CurPoly)->tag == polyNum) {
        local_1d0.NumUsedPolys = 1;
        dVar9 = targ->X - ((local_1d0.CurPoly)->StartSpot).pos.X;
        dVar11 = targ->Y - ((local_1d0.CurPoly)->StartSpot).pos.Y;
        local_1d0.UsedPolys[0] = polyNum;
        dVar4 = c_sqrt(dVar11 * dVar11 + dVar9 * dVar9);
        pFVar5 = FPolyMirrorIterator::NextMirror(&local_1d0);
        if (pFVar5 == (FPolyObj *)0x0) {
          return false;
        }
        dVar10 = (double)(~-(ulong)(dVar4 != 0.0) & (ulong)dVar4 |
                         (ulong)(1.0 / dVar4) & -(ulong)(dVar4 != 0.0));
        dVar11 = dVar11 * dVar10;
        local_238._8_4_ = SUB84(dVar11,0);
        local_238._0_8_ = dVar9 * dVar10;
        local_238._12_4_ = (int)((ulong)dVar11 >> 0x20);
        auVar1._8_4_ = SUB84(speed,0);
        auVar1._0_8_ = speed;
        auVar1._12_4_ = (int)((ulong)speed >> 0x20);
        auVar2._8_4_ = SUB84(dVar4,0);
        auVar2._0_8_ = dVar4;
        auVar2._12_4_ = (int)((ulong)dVar4 >> 0x20);
        bVar8 = false;
        goto LAB_0058a733;
      }
      lVar7 = lVar7 + -1;
      local_1d0.CurPoly = local_1d0.CurPoly + 1;
    } while (lVar7 != 0);
  }
  Printf("EV_MovePolyTo: Invalid polyobj num: %d\n");
  return false;
LAB_0058a733:
  pDVar6 = (pFVar5->specialdata).field_0.p;
  if (pDVar6 == (DPolyAction *)0x0) {
LAB_0058a759:
    if (pFVar5->bBlocked == true && !overRide) {
      return bVar8;
    }
  }
  else {
    if (((pDVar6->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0) {
      (pFVar5->specialdata).field_0.p = (DPolyAction *)0x0;
      goto LAB_0058a759;
    }
    if (!overRide) {
      return bVar8;
    }
  }
  pDVar6 = (DPolyAction *)
           M_Malloc_Dbg(0x78,
                        "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/dobject.h"
                        ,0x1f7);
  DPolyAction::DPolyAction(pDVar6,pFVar5->tag);
  (pDVar6->super_DThinker).super_DObject._vptr_DObject = (_func_int **)&PTR_StaticType_008730a8;
  pDVar6[1].super_DThinker.super_DObject.ObjNext = (DObject *)0x0;
  pDVar6[1].super_DThinker.super_DObject.GCNext = (DObject *)0x0;
  (pFVar5->specialdata).field_0.p = pDVar6;
  pFVar5->bBlocked = false;
  pDVar6->m_Dist = dVar4;
  pDVar6->m_Speed = speed;
  dStack_1f0 = auVar1._8_8_;
  auVar3._8_4_ = SUB84((double)local_238._8_8_ * dStack_1f0,0);
  auVar3._0_8_ = (double)local_238._0_8_ * speed;
  auVar3._12_4_ = (int)((ulong)((double)local_238._8_8_ * dStack_1f0) >> 0x20);
  pDVar6[1].super_DThinker.super_DObject._vptr_DObject =
       (_func_int **)((double)local_238._0_8_ * speed);
  pDVar6[1].super_DThinker.super_DObject.Class = (PClass *)auVar3._8_8_;
  dStack_200 = auVar2._8_8_;
  dVar11 = (pFVar5->StartSpot).pos.Y;
  pDVar6[1].super_DThinker.super_DObject.ObjNext =
       (DObject *)((pFVar5->StartSpot).pos.X + dVar4 * (double)local_238._0_8_);
  pDVar6[1].super_DThinker.super_DObject.GCNext =
       (DObject *)(dVar11 + dStack_200 * (double)local_238._8_8_);
  if ((dVar4 / speed <= 2.0) &&
     (this = (pDVar6->m_Interpolation).field_0.p, this != (DInterpolation *)0x0)) {
    if (((this->super_DObject).ObjectFlags & 0x20) == 0) {
      DInterpolation::DelRef(this,false);
    }
    (pDVar6->m_Interpolation).field_0.p = (DInterpolation *)0x0;
  }
  local_238._8_8_ = -(double)local_238._8_8_;
  local_238._0_8_ = -(double)local_238._0_8_;
  pFVar5 = FPolyMirrorIterator::NextMirror(&local_1d0);
  bVar8 = true;
  if (pFVar5 == (FPolyObj *)0x0) {
    return true;
  }
  goto LAB_0058a733;
}

Assistant:

bool EV_MovePolyTo(line_t *line, int polyNum, double speed, const DVector2 &targ, bool overRide)
{
	DMovePolyTo *pe = NULL;
	FPolyObj *poly;
	DVector2 dist;
	double distlen;

	if ((poly = PO_GetPolyobj(polyNum)) == NULL)
	{
		Printf("EV_MovePolyTo: Invalid polyobj num: %d\n", polyNum);
		return false;
	}
	FPolyMirrorIterator it(poly);

	dist = targ - poly->StartSpot.pos;
	distlen = dist.MakeUnit();
	while ((poly = it.NextMirror()) != NULL)
	{
		if ((poly->specialdata != NULL || poly->bBlocked) && !overRide)
		{ // poly is already in motion
			break;
		}
		pe = new DMovePolyTo(poly->tag);
		poly->specialdata = pe;
		poly->bBlocked = false;
		pe->m_Dist = distlen;
		pe->m_Speed = speed;
		pe->m_Speedv = dist * speed;
		pe->m_Target = poly->StartSpot.pos + dist * distlen;
		if ((pe->m_Dist / pe->m_Speed) <= 2)
		{
			pe->StopInterpolation();
		}
		dist = -dist;	// reverse the direction
	}
	return pe != NULL; // Return true if something started moving.
}